

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  cmTest *pcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  long *plVar4;
  undefined8 uVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  bool bVar8;
  TargetType TVar9;
  cmake *cmakeInstance;
  cmListFileBacktrace *pcVar10;
  size_t sVar11;
  ostream *poVar12;
  cmGeneratorTarget *this_00;
  string *psVar13;
  Indent IVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  WrapQuotes wrapQuotes;
  undefined8 uVar15;
  pointer ppVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  string_view str;
  string_view str_00;
  string_view str_01;
  anon_class_40_5_cf5cfc57 addLauncher;
  string equalSigns;
  string exe;
  cmList argv;
  cmGeneratorExpression ge;
  undefined1 local_148 [16];
  undefined1 local_138 [24];
  undefined1 local_120 [8];
  string local_118;
  _Alloc_hider local_f8;
  char *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d0;
  undefined1 local_b0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  cmListFileBacktrace local_90;
  long *local_80 [2];
  long local_70 [2];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  cmGeneratorExpression local_48;
  
  this->TestGenerated = true;
  local_f8._M_p = (pointer)config;
  cmakeInstance = cmMakefile::GetCMakeInstance(this->Test->Makefile);
  local_120 = (undefined1  [8])this;
  pcVar10 = cmTest::GetBacktrace(this->Test);
  local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (pcVar10->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (pcVar10->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  cmGeneratorExpression::cmGeneratorExpression(&local_48,cmakeInstance,&local_90);
  if (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pcVar1 = *(cmTest **)((long)local_120 + 0x78);
  pcVar2 = pcVar1->Makefile;
  local_148._0_8_ = local_138;
  pcVar3 = (pcVar1->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_148,pcVar3,pcVar3 + (pcVar1->Name)._M_string_length);
  bVar7 = anon_unknown.dwarf_face33::needToQuoteTestName(pcVar2,(string *)local_148);
  if ((undefined1 *)local_148._0_8_ != local_138) {
    operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
  }
  local_148._0_8_ = local_138;
  pcVar3 = ((*(cmTest **)((long)local_120 + 0x78))->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_148,pcVar3,
             pcVar3 + ((*(cmTest **)((long)local_120 + 0x78))->Name)._M_string_length);
  sVar11 = anon_unknown.dwarf_face33::countMaxConsecutiveEqualSigns((string *)local_148);
  local_f0 = local_e8._M_local_buf + 8;
  std::__cxx11::string::_M_construct((ulong)&local_f0,(char)sVar11 + '\x01');
  if ((undefined1 *)local_148._0_8_ != local_138) {
    operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
  }
  if (bVar7) {
    IVar14.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar14.Level = IVar14.Level + -1;
      } while (IVar14.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_test([",10);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,local_f0,local_e8._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"[",1);
    local_148._0_8_ = local_138;
    pcVar3 = ((*(cmTest **)((long)local_120 + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,pcVar3,
               pcVar3 + ((*(cmTest **)((long)local_120 + 0x78))->Name)._M_string_length);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(char *)local_148._0_8_,local_148._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,local_f0,local_e8._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
  }
  else {
    IVar14.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar14.Level = IVar14.Level + -1;
      } while (IVar14.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_test(",9);
    local_148._0_8_ = local_138;
    pcVar3 = ((*(cmTest **)((long)local_120 + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,pcVar3,
               pcVar3 + ((*(cmTest **)((long)local_120 + 0x78))->Name)._M_string_length);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,(char *)local_148._0_8_,local_148._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138) {
    operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
  }
  auVar6 = local_120;
  EvaluateCommandLineArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_148,(cmTestGenerator *)local_120,
             &(*(cmTest **)((long)local_120 + 0x78))->Command,&local_48,(string *)local_f8._M_p);
  bVar8 = cmTest::GetCommandExpandLists(*(cmTest **)((long)auVar6 + 0x78));
  uVar15 = 1;
  cmList::
  cmList<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((cmList *)(local_b0 + 8),
             (move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )local_148._0_8_,
             (move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )local_148._8_8_,(uint)bVar8,Yes);
  uVar5 = local_148._0_8_;
  if (local_148._8_8_ != local_148._0_8_) {
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_148._0_8_ + 0x10);
    do {
      plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (paVar17 + -1))->_M_dataplus)._M_p;
      if (paVar17 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar4) {
        operator_delete(plVar4,paVar17->_M_allocated_capacity + 1);
      }
      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar17 + 1);
      paVar17 = paVar17 + 2;
    } while (pbVar18 !=
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148._8_8_);
    local_148._8_8_ = uVar5;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ == local_a0._M_pi) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_b0 + 8));
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar3 = (((cmListFileContext *)local_b0._8_8_)->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,
             pcVar3 + (((cmListFileContext *)local_b0._8_8_)->Name)._M_string_length);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse
                      ((cmLocalGenerator *)
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_120 + 0x70))->_M_allocated_capacity,&local_d0);
  if ((this_00 == (cmGeneratorTarget *)0x0) ||
     (TVar9 = cmGeneratorTarget::GetType(this_00), TVar9 != EXECUTABLE)) {
    cmsys::SystemTools::ConvertToUnixSlashes(&local_d0);
  }
  else {
    uVar15 = 0;
    cmGeneratorTarget::GetFullPath
              ((string *)local_148,this_00,(string *)local_f8._M_p,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)local_148);
    if ((cmTestGenerator *)local_148._0_8_ != (cmTestGenerator *)local_138) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
    }
    local_148._0_8_ = local_120;
    local_148._8_8_ = local_f8._M_p;
    paVar17 = &local_118.field_2;
    local_138._0_8_ = &local_48;
    local_138._8_8_ = os;
    local_138._16_8_ = this_00;
    local_118._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_120 + 8),"TEST_LAUNCHER","");
    GenerateScriptForConfig::anon_class_40_5_cf5cfc57::operator()
              ((anon_class_40_5_cf5cfc57 *)local_148,(string *)(local_120 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar17) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    if ((*(cmTest **)((long)local_120 + 0x78))->PolicyStatusCMP0158 == NEW) {
      pcVar2 = *(cmMakefile **)
                (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)local_120 + 0x70))->_M_allocated_capacity + 0x70);
      local_118._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_120 + 8),"CMAKE_CROSSCOMPILING","");
      bVar8 = cmMakefile::IsOn(pcVar2,(string *)(local_120 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar17) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar8) goto LAB_00366139;
    }
    local_118._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_120 + 8),"CROSSCOMPILING_EMULATOR","");
    GenerateScriptForConfig::anon_class_40_5_cf5cfc57::operator()
              ((anon_class_40_5_cf5cfc57 *)local_148,(string *)(local_120 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar17) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
  }
LAB_00366139:
  str._M_str = (char *)0x0;
  str._M_len = (size_t)local_d0._M_dataplus._M_p;
  cmOutputConverter::EscapeForCMake_abi_cxx11_
            ((string *)local_148,(cmOutputConverter *)local_d0._M_string_length,str,
             (WrapQuotes)uVar15);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_148._0_8_,local_148._8_8_);
  if ((cmTestGenerator *)local_148._0_8_ != (cmTestGenerator *)local_138) {
    operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
  }
  psVar13 = &((cmListFileContext *)local_b0._8_8_)->FilePath;
  if (psVar13 != (string *)local_a0._M_pi) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      str_00._M_str = (char *)0x0;
      str_00._M_len = (size_t)(psVar13->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)local_148,(cmOutputConverter *)psVar13->_M_string_length,str_00,
                 (WrapQuotes)uVar15);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_148._0_8_,local_148._8_8_)
      ;
      if ((cmTestGenerator *)local_148._0_8_ != (cmTestGenerator *)local_138) {
        operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
      }
      psVar13 = psVar13 + 1;
    } while (psVar13 != (string *)local_a0._M_pi);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  if (bVar7) {
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties([",0x16);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,local_f0,local_e8._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"[",1);
    local_148._0_8_ = local_138;
    pcVar3 = ((*(cmTest **)((long)local_120 + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,pcVar3,
               pcVar3 + ((*(cmTest **)((long)local_120 + 0x78))->Name)._M_string_length);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(char *)local_148._0_8_,local_148._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,local_f0,local_e8._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] PROPERTIES ",0xd);
  }
  else {
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties(",0x15);
    local_148._0_8_ = local_138;
    pcVar3 = ((*(cmTest **)((long)local_120 + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,pcVar3,
               pcVar3 + ((*(cmTest **)((long)local_120 + 0x78))->Name)._M_string_length);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,(char *)local_148._0_8_,local_148._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," PROPERTIES ",0xc);
  }
  if ((undefined1 *)local_148._0_8_ != local_138) {
    operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
  }
  cmPropertyMap::GetList_abi_cxx11_(&local_60,&(*(cmTest **)((long)local_120 + 0x78))->Properties);
  if (local_60.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar16 = local_60.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (os,(ppVar16->first)._M_dataplus._M_p,(ppVar16->first)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      local_80[0] = local_70;
      pcVar3 = (ppVar16->second)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar3,pcVar3 + (ppVar16->second)._M_string_length);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_b0,(string *)&local_48);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      wrapQuotes = Wrap;
      psVar13 = cmCompiledGeneratorExpression::Evaluate
                          ((cmCompiledGeneratorExpression *)local_b0._0_8_,
                           (cmLocalGenerator *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)local_120 + 0x70))->_M_allocated_capacity,
                           (string *)local_f8._M_p,(cmGeneratorTarget *)0x0,
                           (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                           (string *)(local_120 + 8));
      str_01._M_str = (char *)0x0;
      str_01._M_len = (size_t)(psVar13->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)local_148,(cmOutputConverter *)psVar13->_M_string_length,str_01,
                 wrapQuotes);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,(char *)local_148._0_8_,local_148._8_8_);
      if ((undefined1 *)local_148._0_8_ != local_138) {
        operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)local_b0);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      ppVar16 = ppVar16 + 1;
    } while (ppVar16 !=
             local_60.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_60);
  GenerateInternalProperties((cmTestGenerator *)local_120,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_b0 + 8));
  if (local_f0 != local_e8._M_local_buf + 8) {
    operator_delete(local_f0,local_e8._8_8_ + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression(&local_48);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(*this->Test->GetMakefile()->GetCMakeInstance(),
                           this->Test->GetBacktrace());

  // Determine if policy CMP0110 is set to NEW.
  const bool quote_test_name =
    needToQuoteTestName(*this->Test->GetMakefile(), this->Test->GetName());
  // Determine the number of equal-signs needed for quoting test name with
  // [==[...]==] syntax.
  const std::string equalSigns(
    1 + countMaxConsecutiveEqualSigns(this->Test->GetName()), '=');

  // Start the test command.
  if (quote_test_name) {
    os << indent << "add_test([" << equalSigns << "[" << this->Test->GetName()
       << "]" << equalSigns << "] ";
  } else {
    os << indent << "add_test(" << this->Test->GetName() << " ";
  }

  // Evaluate command line arguments
  cmList argv{
    this->EvaluateCommandLineArguments(this->Test->GetCommand(), ge, config),
    // Expand arguments if COMMAND_EXPAND_LISTS is set
    this->Test->GetCommandExpandLists() ? cmList::ExpandElements::Yes
                                        : cmList::ExpandElements::No,
    cmList::EmptyElements::Yes
  };
  // Expanding lists on an empty command may have left it empty
  if (argv.empty()) {
    argv.emplace_back();
  }

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = argv[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    auto addLauncher = [this, &config, &ge, &os,
                        target](std::string const& propertyName) {
      cmValue launcher = target->GetProperty(propertyName);
      if (!cmNonempty(launcher)) {
        return;
      }
      cmList launcherWithArgs{ ge.Parse(*launcher)->Evaluate(this->LG,
                                                             config) };
      if (!launcherWithArgs.empty() && !launcherWithArgs[0].empty()) {
        std::string launcherExe(launcherWithArgs[0]);
        cmSystemTools::ConvertToUnixSlashes(launcherExe);
        os << cmOutputConverter::EscapeForCMake(launcherExe) << " ";
        for (std::string const& arg :
             cmMakeRange(launcherWithArgs).advance(1)) {
          os << cmOutputConverter::EscapeForCMake(arg) << " ";
        }
      }
    };

    // Prepend with the test launcher if specified.
    addLauncher("TEST_LAUNCHER");

    // Prepend with the emulator when cross compiling if required.
    if (!this->GetTest()->GetCMP0158IsNew() ||
        this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
      addLauncher("CROSSCOMPILING_EMULATOR");
    }
  } else {
    // Use the command name given.
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);

  for (auto const& arg : cmMakeRange(argv).advance(1)) {
    os << " " << cmOutputConverter::EscapeForCMake(arg);
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  if (quote_test_name) {
    os << indent << "set_tests_properties([" << equalSigns << "["
       << this->Test->GetName() << "]" << equalSigns << "] PROPERTIES ";
  } else {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
  }
  for (auto const& i : this->Test->GetProperties().GetList()) {
    os << " " << i.first << " "
       << cmOutputConverter::EscapeForCMake(
            ge.Parse(i.second)->Evaluate(this->LG, config));
  }
  this->GenerateInternalProperties(os);
  os << ")\n";
}